

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ScopedNameSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ScopedNameSyntax,slang::syntax::NameSyntax&,slang::parsing::Token,slang::syntax::NameSyntax&>
          (BumpAllocator *this,NameSyntax *args,Token *args_1,NameSyntax *args_2)

{
  Token separator;
  ScopedNameSyntax *pSVar1;
  NameSyntax *in_RCX;
  BumpAllocator *in_RDX;
  ScopedNameSyntax *in_RSI;
  undefined8 in_RDI;
  Info *unaff_retaddr;
  size_t in_stack_ffffffffffffffd8;
  
  pSVar1 = (ScopedNameSyntax *)allocate(in_RDX,(size_t)in_RCX,in_stack_ffffffffffffffd8);
  separator.info = unaff_retaddr;
  separator.kind = (short)in_RDI;
  separator._2_1_ = (char)((ulong)in_RDI >> 0x10);
  separator.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
  separator.rawLen = (int)((ulong)in_RDI >> 0x20);
  slang::syntax::ScopedNameSyntax::ScopedNameSyntax(in_RSI,(NameSyntax *)in_RDX,separator,in_RCX);
  return pSVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }